

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<unsigned_int,unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
::
emplace_decomposable_with_hash<unsigned_int,std::piecewise_construct_t_const&,std::tuple<unsigned_int_const&>,std::tuple<unsigned_int_const&>>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<unsigned_int,unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          *this,uint *key,size_t hashval,piecewise_construct_t *args,
          tuple<const_unsigned_int_&> *args_1,tuple<const_unsigned_int_&> *args_2)

{
  raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  ctrl_t h;
  size_t sVar1;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *inner_00;
  bool local_a9;
  iterator local_a8;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
  local_98;
  bool local_79;
  iterator local_78;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
  local_68;
  size_t local_50;
  size_t offset;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *prStack_40;
  UniqueLock m;
  EmbeddedSet *set;
  Inner *inner;
  tuple<const_unsigned_int_&> *args_local_1;
  piecewise_construct_t *args_local;
  size_t hashval_local;
  uint *key_local;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_local;
  
  sVar1 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::subidx(hashval);
  inner_00 = &std::
              array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::Inner,_16UL>
              ::operator[]((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::Inner,_16UL>
                            *)this,sVar1)->set_;
  prStack_40 = inner_00;
  LockableBaseImpl<phmap::NullMutex>::DoNothing::
  DoNothing<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<unsigned_int,unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>::Inner&>
            ((DoNothing *)((long)&offset + 7),(Inner *)inner_00);
  local_50 = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::_find_key<unsigned_int>(prStack_40,key,hashval);
  if (local_50 == 0xffffffffffffffff) {
    local_50 = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::prepare_insert(prStack_40,hashval);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_int_const&>,std::tuple<unsigned_int_const&>>
              ((raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                *)prStack_40,local_50,args,args_1,args_2);
    this_00 = prStack_40;
    sVar1 = local_50;
    h = H2(hashval);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::set_ctrl(this_00,sVar1,h);
    local_78 = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::iterator_at(prStack_40,local_50);
    local_79 = true;
    std::
    pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
    ::
    pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool,_true>
              (&local_68,&local_78,&local_79);
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::make_rv(__return_storage_ptr__,
              (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *)this,(Inner *)inner_00,&local_68);
  }
  else {
    local_a8 = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::iterator_at(prStack_40,local_50);
    local_a9 = false;
    std::
    pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
    ::
    pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool,_true>
              (&local_98,&local_a8,&local_a9);
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::make_rv(__return_storage_ptr__,
              (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *)this,(Inner *)inner_00,&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }